

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

char * dict_ciphone_str(dict_t *d,s3wid_t wid,int32 pos)

{
  char *pcVar1;
  int32 pos_local;
  s3wid_t wid_local;
  dict_t *d_local;
  
  if (d == (dict_t *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x44,"const char *dict_ciphone_str(dict_t *, s3wid_t, int32)");
  }
  if ((-1 < wid) && (wid < d->n_word)) {
    if ((-1 < pos) && (pos < d->word[wid].pronlen)) {
      pcVar1 = bin_mdef_ciphone_str(d->mdef,(int)d->word[wid].ciphone[pos]);
      return pcVar1;
    }
    __assert_fail("(pos >= 0) && (pos < d->word[wid].pronlen)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x46,"const char *dict_ciphone_str(dict_t *, s3wid_t, int32)");
  }
  __assert_fail("(wid >= 0) && (wid < d->n_word)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                ,0x45,"const char *dict_ciphone_str(dict_t *, s3wid_t, int32)");
}

Assistant:

const char *
dict_ciphone_str(dict_t * d, s3wid_t wid, int32 pos)
{
    assert(d != NULL);
    assert((wid >= 0) && (wid < d->n_word));
    assert((pos >= 0) && (pos < d->word[wid].pronlen));

    return bin_mdef_ciphone_str(d->mdef, d->word[wid].ciphone[pos]);
}